

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse2.h
# Opt level: O0

void store_buffer_16bit_to_32bit_w8(__m128i *in,int32_t *out,int stride,int out_size)

{
  int in_ECX;
  int in_EDX;
  int iVar1;
  int extraout_EDX;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  long in_RSI;
  long lVar2;
  __m128i a;
  int i;
  undefined4 local_1c;
  
  iVar1 = in_EDX;
  lVar2 = in_RSI;
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    a[0] = in_RSI + (long)(local_1c * in_EDX) * 4;
    a[1] = lVar2;
    store_16bit_to_32bit(a,(int32_t *)CONCAT44(in_register_00000014,iVar1));
    iVar1 = extraout_EDX;
    in_register_00000014 = extraout_var;
  }
  return;
}

Assistant:

static inline void store_buffer_16bit_to_32bit_w8(const __m128i *const in,
                                                  int32_t *const out,
                                                  const int stride,
                                                  const int out_size) {
  for (int i = 0; i < out_size; ++i) {
    store_16bit_to_32bit(in[i], out + i * stride);
  }
}